

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplaintextedit.cpp
# Opt level: O2

void __thiscall QPlainTextEdit::setPlaceholderText(QPlainTextEdit *this,QString *placeholderText)

{
  QString *lhs;
  QPlainTextEditPrivate *this_00;
  bool bVar1;
  
  this_00 = *(QPlainTextEditPrivate **)
             &(this->super_QAbstractScrollArea).super_QFrame.super_QWidget.field_0x8;
  lhs = &this_00->placeholderText;
  bVar1 = ::operator!=(lhs,placeholderText);
  if (bVar1) {
    QString::operator=(lhs,(QString *)placeholderText);
    QPlainTextEditPrivate::updatePlaceholderVisibility(this_00);
    return;
  }
  return;
}

Assistant:

void QPlainTextEdit::setPlaceholderText(const QString &placeholderText)
{
    Q_D(QPlainTextEdit);
    if (d->placeholderText != placeholderText) {
        d->placeholderText = placeholderText;
        d->updatePlaceholderVisibility();
    }
}